

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutil.c
# Opt level: O3

void cCreate_SuperNode_Matrix
               (SuperMatrix *L,int m,int n,int_t nnz,singlecomplex *nzval,int_t *nzval_colptr,
               int_t *rowind,int_t *rowind_colptr,int *col_to_sup,int *sup_to_col,Stype_t stype,
               Dtype_t dtype,Mtype_t mtype)

{
  int_t *piVar1;
  char acStack_138 [264];
  
  L->Stype = stype;
  L->Dtype = dtype;
  L->Mtype = mtype;
  L->nrow = m;
  L->ncol = n;
  piVar1 = (int_t *)superlu_malloc(0x38);
  L->Store = piVar1;
  if (piVar1 == (int_t *)0x0) {
    sprintf(acStack_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for L->Store",0x93,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cutil.c");
    superlu_abort_and_exit(acStack_138);
    piVar1 = (int_t *)L->Store;
  }
  *piVar1 = nnz;
  piVar1[1] = col_to_sup[n];
  *(singlecomplex **)(piVar1 + 2) = nzval;
  *(int_t **)(piVar1 + 4) = nzval_colptr;
  *(int_t **)(piVar1 + 6) = rowind;
  *(int_t **)(piVar1 + 8) = rowind_colptr;
  *(int **)(piVar1 + 10) = col_to_sup;
  *(int **)(piVar1 + 0xc) = sup_to_col;
  return;
}

Assistant:

void
cCreate_SuperNode_Matrix(SuperMatrix *L, int m, int n, int_t nnz, 
			singlecomplex *nzval, int_t *nzval_colptr, int_t *rowind,
			int_t *rowind_colptr, int *col_to_sup, int *sup_to_col,
			Stype_t stype, Dtype_t dtype, Mtype_t mtype)
{
    SCformat *Lstore;

    L->Stype = stype;
    L->Dtype = dtype;
    L->Mtype = mtype;
    L->nrow = m;
    L->ncol = n;
    L->Store = (void *) SUPERLU_MALLOC( sizeof(SCformat) );
    if ( !(L->Store) ) ABORT("SUPERLU_MALLOC fails for L->Store");
    Lstore = L->Store;
    Lstore->nnz = nnz;
    Lstore->nsuper = col_to_sup[n];
    Lstore->nzval = nzval;
    Lstore->nzval_colptr = nzval_colptr;
    Lstore->rowind = rowind;
    Lstore->rowind_colptr = rowind_colptr;
    Lstore->col_to_sup = col_to_sup;
    Lstore->sup_to_col = sup_to_col;

}